

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbox.cpp
# Opt level: O0

void rw::xbox::uninstance(ObjPipeline *rwpipe,Atomic *atomic)

{
  Geometry *this;
  InstanceDataHeader *pIVar1;
  uint32 uVar2;
  Mesh *pMVar3;
  uint16 *indices;
  uint32 i_1;
  uint32 i;
  Mesh *mesh;
  InstanceData *inst;
  InstanceDataHeader *header;
  Geometry *geo;
  ObjPipeline *pipe;
  Atomic *atomic_local;
  ObjPipeline *rwpipe_local;
  
  this = atomic->geometry;
  if ((this->flags & 0x1000000) != 0) {
    pIVar1 = this->instData;
    mesh = *(Mesh **)(pIVar1 + 10);
    pMVar3 = MeshHeader::getMeshes(this->meshHeader);
    this->meshHeader->totalIndices = 0;
    for (indices._4_4_ = 0; indices._4_4_ < *(ushort *)((long)&pIVar1[2].platform + 2);
        indices._4_4_ = indices._4_4_ + 1) {
      pMVar3[indices._4_4_].numIndices = *(uint32 *)((long)mesh + (ulong)indices._4_4_ * 0x28 + 8);
      this->meshHeader->totalIndices =
           pMVar3[indices._4_4_].numIndices + this->meshHeader->totalIndices;
    }
    this->meshHeader->flags = (uint)(pIVar1[3].platform == 6);
    uVar2 = MeshHeader::guessNumTriangles(this->meshHeader);
    this->numTriangles = uVar2;
    Geometry::allocateData(this);
    Geometry::allocateMeshes
              (this,(uint)this->meshHeader->numMeshes,this->meshHeader->totalIndices,0);
    _i_1 = MeshHeader::getMeshes(this->meshHeader);
    for (indices._0_4_ = 0; (uint)indices < *(ushort *)((long)&pIVar1[2].platform + 2);
        indices._0_4_ = (uint)indices + 1) {
      memcpy(_i_1->indices,mesh->material,(long)(int)(mesh->numIndices << 1));
      _i_1 = _i_1 + 1;
      mesh = (Mesh *)&mesh[1].material;
    }
    (**(code **)&rwpipe[1].super_Pipeline.platform)(this,pIVar1);
    Geometry::generateTriangles(this,(int8 *)0x0);
    this->flags = this->flags & 0xfeffffff;
    destroyNativeData(this,0,0);
  }
  return;
}

Assistant:

static void
uninstance(rw::ObjPipeline *rwpipe, Atomic *atomic)
{
	ObjPipeline *pipe = (ObjPipeline*)rwpipe;
	Geometry *geo = atomic->geometry;
	if((geo->flags & Geometry::NATIVE) == 0)
		return;
	assert(geo->instData != nil);
	assert(geo->instData->platform == PLATFORM_XBOX);

	InstanceDataHeader *header = (InstanceDataHeader*)geo->instData;
	InstanceData *inst = header->begin;
	Mesh *mesh = geo->meshHeader->getMeshes();
	// For some reason numIndices in mesh and instance data are not always equal
	// And primitive isn't always correct either. Maybe some internal conversion...
	geo->meshHeader->totalIndices = 0;
	for(uint32 i = 0; i < header->numMeshes; i++){
		mesh[i].numIndices = inst[i].numIndices;
		geo->meshHeader->totalIndices += mesh[i].numIndices;
	}
	geo->meshHeader->flags = header->primType == D3DPT_TRIANGLESTRIP ?
		MeshHeader::TRISTRIP : 0;

	geo->numTriangles = geo->meshHeader->guessNumTriangles();
	geo->allocateData();
	geo->allocateMeshes(geo->meshHeader->numMeshes, geo->meshHeader->totalIndices, 0);

	mesh = geo->meshHeader->getMeshes();
	for(uint32 i = 0; i < header->numMeshes; i++){
		uint16 *indices = (uint16*)inst->indexBuffer;
		memcpy(mesh->indices, indices, inst->numIndices*2);
		mesh++;
		inst++;
	}

	pipe->uninstanceCB(geo, header);
	geo->generateTriangles();
	geo->flags &= ~Geometry::NATIVE;
	destroyNativeData(geo, 0, 0);
}